

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65e8d::Av1Config_GetAv1ConfigFromLobfObu_Test::
~Av1Config_GetAv1ConfigFromLobfObu_Test(Av1Config_GetAv1ConfigFromLobfObu_Test *this)

{
  void *in_RDI;
  
  ~Av1Config_GetAv1ConfigFromLobfObu_Test((Av1Config_GetAv1ConfigFromLobfObu_Test *)0x3b37a8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(Av1Config, GetAv1ConfigFromLobfObu) {
  // Test parsing of a Sequence Header OBU with the reduced_still_picture_header
  // unset-- aka a full Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kLobfFullSequenceHeaderObu,
                         sizeof(kLobfFullSequenceHeaderObu), false));

  // Test parsing of a reduced still image Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kLobfReducedStillImageSequenceHeaderObu,
                         sizeof(kLobfReducedStillImageSequenceHeaderObu),
                         false));
}